

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParser::OpenDDLParser(OpenDDLParser *this,char *buffer,size_t len)

{
  size_t len_local;
  char *buffer_local;
  OpenDDLParser *this_local;
  
  this->m_logCallback = logMessage;
  memset(&this->m_buffer,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector(&this->m_buffer);
  std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::vector(&this->m_stack)
  ;
  this->m_context = (Context *)0x0;
  if (len != 0) {
    setBuffer(this,buffer,len);
  }
  return;
}

Assistant:

OpenDDLParser::OpenDDLParser( const char *buffer, size_t len )
: m_logCallback( &logMessage )
, m_buffer()
, m_context( ddl_nullptr ) {
    if( 0 != len ) {
        setBuffer( buffer, len );
    }
}